

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

void __thiscall Socket::Poll::Private::Private(Private *this)

{
  Item *pIVar1;
  Item *pIVar2;
  code *pcVar3;
  int iVar4;
  epoll_event ev;
  uint32_t local_24;
  undefined8 local_20;
  
  pIVar1 = &(this->sockets).endItem;
  (this->sockets)._end.item = pIVar1;
  (this->sockets)._begin.item = pIVar1;
  (this->sockets)._size = 0;
  (this->sockets).capacity = 500;
  (this->sockets).data = (Item **)0x0;
  (this->sockets).endItem.key = (Socket *)0x0;
  (this->sockets).endItem.value.socket = (Socket *)0x0;
  (this->sockets).endItem.value.events = 0;
  (this->sockets).endItem.value.s = 0;
  (this->sockets).endItem.prev = (Item *)0x0;
  (this->sockets).endItem.next = (Item *)0x0;
  (this->sockets).freeItem = (Item *)0x0;
  (this->sockets).blocks = (ItemBlock *)0x0;
  pIVar2 = &(this->selectedSockets).endItem;
  (this->selectedSockets)._end.item = pIVar2;
  (this->selectedSockets)._begin.item = pIVar2;
  (this->selectedSockets)._size = 0;
  (this->selectedSockets).capacity = 500;
  (this->selectedSockets).data = (Item **)0x0;
  (this->selectedSockets).endItem.key = (Socket *)0x0;
  (this->selectedSockets).endItem.value = 0;
  (this->selectedSockets).endItem.prev = (Item *)0x0;
  (this->selectedSockets).endItem.next = (Item *)0x0;
  (this->selectedSockets).freeItem = (Item *)0x0;
  (this->selectedSockets).blocks = (ItemBlock *)0x0;
  iVar4 = epoll_create1(0x80000);
  this->fd = iVar4;
  iVar4 = eventfd(0,0x80000);
  this->eventFd = iVar4;
  local_24 = 0x2011;
  local_20 = 0;
  iVar4 = epoll_ctl(this->fd,1,iVar4,(epoll_event *)&local_24);
  if (iVar4 != 0) {
    iVar4 = Debug::printf("%s:%u: verification failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Socket/Socket.cpp"
                          ,0x492,"epoll_ctl(fd, EPOLL_CTL_ADD, eventFd, &ev) == 0");
    if (iVar4 != 0) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
  }
  return;
}

Assistant:

Socket::Poll::Private::Private()
{
  fd = epoll_create1(EPOLL_CLOEXEC);
  eventFd = eventfd(0, EFD_CLOEXEC);
  epoll_event ev;
  ev.events = EPOLLIN | EPOLLRDHUP | EPOLLHUP;
  ev.data.ptr = NULL;
  VERIFY(epoll_ctl(fd, EPOLL_CTL_ADD, eventFd, &ev) == 0);
}